

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

ArgVariant * conv_int<bool,void>(ArgVariant *__return_storage_ptr__,bool integral)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  short sVar4;
  uint local_20;
  short local_1c;
  char local_19;
  uint local_18;
  undefined1 local_11;
  int32_t i;
  bool integral_local;
  
  local_18 = (uint)integral;
  local_11 = integral;
  _i = __return_storage_ptr__;
  cVar3 = std::numeric_limits<signed_char>::min();
  uVar1 = local_18;
  if (((int)cVar3 <= (int)(uint)integral) &&
     (cVar3 = std::numeric_limits<signed_char>::max(), (int)uVar1 <= (int)cVar3)) {
    local_19 = (char)local_18;
    eggs::variants::
    variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
    variant<signed_char,1ul,signed_char>
              ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
                *)__return_storage_ptr__,&local_19);
    return __return_storage_ptr__;
  }
  uVar1 = local_18;
  sVar4 = std::numeric_limits<short>::min();
  uVar2 = local_18;
  if (((int)sVar4 <= (int)uVar1) &&
     (sVar4 = std::numeric_limits<short>::max(), (int)uVar2 <= (int)sVar4)) {
    local_1c = (short)local_18;
    eggs::variants::
    variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
    variant<short,2ul,short>
              ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
                *)__return_storage_ptr__,&local_1c);
    return __return_storage_ptr__;
  }
  local_20 = local_18;
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<int,3ul,int>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)__return_storage_ptr__,(int *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

static ArgVariant conv_int(T integral)
{
    int32_t i = static_cast<int32_t>(integral);

    if(i >= std::numeric_limits<int8_t>::min() && i <= std::numeric_limits<int8_t>::max())
        return int8_t(i);
    else if(i >= std::numeric_limits<int16_t>::min() && i <= std::numeric_limits<int16_t>::max())
        return int16_t(i);
    else
        return int32_t(i);
}